

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O2

uc_afl_ret __thiscall UCAFL::fsrv_run(UCAFL *this)

{
  uc_afl_ret uVar1;
  bool afl_exist;
  double __x;
  
  _may_use_shm_testcase(this);
  _afl_setup(this);
  if (this->has_afl_ == true) {
    _uc_setup(this);
  }
  uVar1 = _fksrv_start(this);
  log(__x);
  switch(uVar1) {
  case UC_AFL_RET_ERROR:
  case UC_AFL_RET_CALLED_TWICE:
  case UC_AFL_RET_FINISHED:
    return uVar1;
  case UC_AFL_RET_CHILD:
    afl_exist = true;
    break;
  case UC_AFL_RET_NO_AFL:
    this->persistent_iters_ = 1;
    afl_exist = false;
    break;
  default:
    return UC_AFL_RET_ERROR;
  }
  uVar1 = _child_fuzz(this,afl_exist);
  return uVar1;
}

Assistant:

uc_afl_ret fsrv_run() {
        uc_afl_ret ret;
        this->_may_use_shm_testcase();
        this->_afl_setup();
        if (this->has_afl_) {
            this->_uc_setup();
        }

        ret = this->_fksrv_start();

        ERR("fksrv_start returns %d\n", ret);

        switch (ret) {
        case UC_AFL_RET_CHILD:
            // We are the child.
            return this->_child_fuzz(true);
        case UC_AFL_RET_NO_AFL:
            this->persistent_iters_ = 1;
            // Only run once.
            return this->_child_fuzz(false);
        case UC_AFL_RET_FINISHED:
        case UC_AFL_RET_ERROR:
        case UC_AFL_RET_CALLED_TWICE:
            return ret;
        default:
            return UC_AFL_RET_ERROR;
        }
    }